

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O3

uint64_t __thiscall mkvmuxer::Chapters::WriteEdition(Chapters *this,IMkvWriter *writer)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint64_t uVar4;
  uint64 uVar5;
  undefined4 extraout_var;
  uint64_t uVar6;
  undefined4 extraout_var_00;
  long lVar7;
  uint64 value;
  long lVar8;
  
  if (this->chapters_count_ < 1) {
    value = 0;
  }
  else {
    lVar8 = 0;
    lVar7 = 0;
    value = 0;
    do {
      uVar4 = Chapter::WriteAtom((Chapter *)((long)&this->chapters_->id_ + lVar8),(IMkvWriter *)0x0)
      ;
      value = value + uVar4;
      lVar7 = lVar7 + 1;
      lVar8 = lVar8 + 0x30;
    } while (lVar7 < this->chapters_count_);
  }
  uVar5 = EbmlMasterElementSize(0x45b9,value);
  uVar4 = uVar5 + value;
  if (writer != (IMkvWriter *)0x0) {
    iVar2 = (*writer->_vptr_IMkvWriter[1])(writer);
    bVar1 = WriteEbmlMasterElement(writer,0x45b9,value);
    if (bVar1) {
      if (0 < this->chapters_count_) {
        lVar8 = 0;
        lVar7 = 0;
        do {
          uVar6 = Chapter::WriteAtom((Chapter *)((long)&this->chapters_->id_ + lVar8),writer);
          if (uVar6 == 0) goto LAB_0011b565;
          lVar7 = lVar7 + 1;
          lVar8 = lVar8 + 0x30;
        } while (lVar7 < this->chapters_count_);
      }
      iVar3 = (*writer->_vptr_IMkvWriter[1])(writer);
      uVar6 = 0;
      if (CONCAT44(extraout_var_00,iVar3) - CONCAT44(extraout_var,iVar2) == uVar4) {
        uVar6 = uVar4;
      }
      if (CONCAT44(extraout_var,iVar2) <= CONCAT44(extraout_var_00,iVar3)) {
        uVar4 = uVar6;
      }
    }
    else {
LAB_0011b565:
      uVar4 = 0;
    }
  }
  return uVar4;
}

Assistant:

uint64_t Chapters::WriteEdition(IMkvWriter* writer) const {
  uint64_t payload_size = 0;

  for (int idx = 0; idx < chapters_count_; ++idx) {
    const Chapter& chapter = chapters_[idx];
    payload_size += chapter.WriteAtom(NULL);
  }

  const uint64_t edition_size =
      EbmlMasterElementSize(libwebm::kMkvEditionEntry, payload_size) +
      payload_size;

  if (writer == NULL)  // return size only
    return edition_size;

  const int64_t start = writer->Position();

  if (!WriteEbmlMasterElement(writer, libwebm::kMkvEditionEntry, payload_size))
    return 0;  // error

  for (int idx = 0; idx < chapters_count_; ++idx) {
    const Chapter& chapter = chapters_[idx];

    const uint64_t chapter_size = chapter.WriteAtom(writer);
    if (chapter_size == 0)  // error
      return 0;
  }

  const int64_t stop = writer->Position();

  if (stop >= start && uint64_t(stop - start) != edition_size)
    return 0;

  return edition_size;
}